

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O0

void __thiscall CholeskyFactor::solveL(CholeskyFactor *this,QpVector *rhs)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  long in_RSI;
  byte *in_RDI;
  HighsInt j;
  HighsInt r;
  CholeskyFactor *in_stack_000001f0;
  int local_18;
  int local_14;
  
  if ((*in_RDI & 1) == 0) {
    recompute(in_stack_000001f0);
  }
  if (*(int *)(in_RDI + 0x18) == *(int *)(in_RSI + 4)) {
    for (local_14 = 0; local_14 < *(int *)(in_RSI + 4); local_14 = local_14 + 1) {
      for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),
                            (long)local_18);
        dVar1 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                            (long)(local_18 * *(int *)(in_RDI + 0x1c) + local_14));
        dVar2 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),
                            (long)local_14);
        *pvVar3 = -dVar1 * dVar2 + *pvVar3;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                          (long)(local_14 * *(int *)(in_RDI + 0x1c) + local_14));
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)local_14)
      ;
      *pvVar3 = *pvVar3 / dVar1;
    }
  }
  else {
    printf("dimension mismatch\n");
  }
  return;
}

Assistant:

void solveL(QpVector& rhs) {
    if (!uptodate) {
      recompute();
    }

    if (current_k != rhs.dim) {
      printf("dimension mismatch\n");
      return;
    }

    for (HighsInt r = 0; r < rhs.dim; r++) {
      for (HighsInt j = 0; j < r; j++) {
        rhs.value[r] -= rhs.value[j] * L[j * current_k_max + r];
      }

      rhs.value[r] /= L[r * current_k_max + r];
    }
  }